

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O1

void * zt_threadpool_get_oput(zt_threadpool *tpool)

{
  zt_threadpool_entry *pzVar1;
  anon_struct_16_2_4dd83919_for_next *paVar2;
  void *pvVar3;
  zt_threadpool_entry *__ptr;
  
  if (_zt_threads_lock_cbs.lock != (_func_int_int_zt_threads_mutex_ptr *)0x0) {
    (*_zt_threads_lock_cbs.lock)(0,tpool->oput_mutex);
  }
  __ptr = (tpool->oput_queue).tqh_first;
  if (__ptr == (zt_threadpool_entry *)0x0) {
    __ptr = (zt_threadpool_entry *)0x0;
  }
  else {
    pzVar1 = (__ptr->next).tqe_next;
    paVar2 = &pzVar1->next;
    if (pzVar1 == (zt_threadpool_entry *)0x0) {
      paVar2 = (anon_struct_16_2_4dd83919_for_next *)&tpool->oput_queue;
    }
    paVar2->tqe_prev = (__ptr->next).tqe_prev;
    *(__ptr->next).tqe_prev = pzVar1;
  }
  if (_zt_threads_lock_cbs.unlock != (_func_int_int_zt_threads_mutex_ptr *)0x0) {
    (*_zt_threads_lock_cbs.unlock)(0,tpool->oput_mutex);
  }
  if (__ptr == (zt_threadpool_entry *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = __ptr->data;
    free(__ptr);
  }
  return pvVar3;
}

Assistant:

void *
zt_threadpool_get_oput(zt_threadpool *tpool) {
    zt_threadpool_entry *entry = NULL;
    void                *data;

    zt_threads_lock(0, tpool->oput_mutex);

    do {
        if (TAILQ_EMPTY(&tpool->oput_queue)) {
            break;
        }

        entry = TAILQ_FIRST(&tpool->oput_queue);
        TAILQ_REMOVE(&tpool->oput_queue, entry, next);
    } while (0);

    zt_threads_unlock(0, tpool->oput_mutex);

    if (entry == NULL) {
        return NULL;
    }

    data = entry->data;
    free(entry);

    return data;
}